

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_rr(ASMState *as,x86Op xo,Reg r1,Reg r2)

{
  MCode *pMVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  MCode *p;
  Reg r2_local;
  Reg r1_local;
  x86Op xo_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_10;
  
  pMVar1 = as->mcp;
  pMVar1[-1] = (char)((r1 & 7) << 3) + -0x40 + ((byte)r2 & 7);
  iVar2 = (int)(char)xo;
  if (iVar2 == -0x3c) {
    *(x86Op *)(pMVar1 + -5) = ((r1 >> 1 & 4) + (r2 >> 3 & 1)) * 0x2000 ^ xo;
    local_10 = pMVar1 + -5;
  }
  else {
    *(x86Op *)(pMVar1 + -5) = xo;
    pbVar4 = pMVar1 + iVar2;
    iVar3 = (r1 >> 1 & 0x104) + 0x40 + (r2 >> 3 & 1);
    _n = pbVar4;
    if (iVar3 != 0x40) {
      as_local._4_1_ = (byte)(r1 >> 0x10) | (byte)iVar3;
      if (iVar2 == -4) {
        *pbVar4 = as_local._4_1_;
        as_local._4_1_ = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar4 = as_local._4_1_;
        as_local._4_1_ = 0x66;
      }
      _n = pbVar4 + -1;
      pbVar4[-1] = as_local._4_1_;
    }
    local_10 = _n;
  }
  as->mcp = local_10;
  return;
}

Assistant:

static void emit_rr(ASMState *as, x86Op xo, Reg r1, Reg r2)
{
  MCode *p = as->mcp;
  as->mcp = emit_opm(xo, XM_REG, r1, r2, p, 0);
}